

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::SetGlider(Board *this,int fromTopEdge,int fromLeftEdge)

{
  initializer_list<Cord> __l;
  vector<Cord,_std::allocator<Cord>_> glider;
  allocator_type local_61;
  vector<Cord,_std::allocator<Cord>_> local_60;
  Cord local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  GenerateEmptyBoard(this);
  local_48.x = 0;
  local_48.y = 1;
  uStack_40 = 0x200000001;
  local_38 = 2;
  uStack_30 = 0x100000002;
  local_28 = 0x200000002;
  __l._M_len = 5;
  __l._M_array = &local_48;
  std::vector<Cord,_std::allocator<Cord>_>::vector(&local_60,__l,&local_61);
  PopulateBoard(this,&local_60,fromTopEdge,fromLeftEdge);
  if (local_60.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Board::SetGlider(int fromTopEdge, int fromLeftEdge)
{
    GenerateEmptyBoard();
    
    const std::vector<Cord> glider {Cord(0, 1), Cord(1, 2), Cord(2, 0), Cord(2, 1), Cord(2, 2)};

    PopulateBoard(glider, fromTopEdge, fromLeftEdge);
}